

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int *piVar7;
  uint *puVar8;
  void *pvVar9;
  void *pvVar10;
  byte bVar11;
  ushort uVar12;
  mz_bool mVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  mz_zip_internal_state *pmVar17;
  short *psVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  long lVar22;
  uint uVar23;
  size_t sVar24;
  mz_uint32 mVar25;
  mz_zip_internal_state *pmVar26;
  ulong uVar27;
  mz_zip_error mVar28;
  int *piVar29;
  mz_uint32 t;
  ulong uVar30;
  long lVar31;
  mz_uint64 mVar32;
  uint uVar33;
  mz_uint64 mVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  mz_zip_internal_state *pState;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  
  uVar27 = pZip->m_archive_size;
  mVar28 = MZ_ZIP_NOT_AN_ARCHIVE;
  if (0x15 < uVar27) {
    mVar34 = 0;
    if (0x1000 < (long)uVar27) {
      mVar34 = uVar27 - 0x1000;
    }
    do {
      sVar24 = uVar27 - mVar34;
      if (0xfff < sVar24) {
        sVar24 = 0x1000;
      }
      sVar15 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar34,buf_u32,sVar24);
      if (sVar15 != sVar24) break;
      for (uVar23 = (int)sVar24 - 4; -1 < (int)uVar23; uVar23 = uVar23 - 1) {
        if ((*(int *)((long)buf_u32 + (ulong)uVar23) == 0x6054b50) &&
           (mVar32 = uVar23 + mVar34, 0x15 < pZip->m_archive_size - mVar32)) {
          sVar24 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar32,buf_u32,0x16);
          mVar28 = MZ_ZIP_FILE_READ_FAILED;
          if (sVar24 != 0x16) goto LAB_0010626b;
          if (buf_u32[0] != 0x6054b50) {
            mVar28 = MZ_ZIP_NOT_AN_ARCHIVE;
            goto LAB_0010626b;
          }
          if (((0x4b < (long)mVar32) &&
              (sVar24 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar32 - 0x14,
                                         zip64_end_of_central_dir_locator_u32,0x14), sVar24 == 0x14)
              ) && (zip64_end_of_central_dir_locator_u32[0] == 0x7064b50)) {
            mVar28 = MZ_ZIP_NOT_AN_ARCHIVE;
            if (pZip->m_archive_size - 0x38 < (ulong)zip64_end_of_central_dir_locator_u32._8_8_)
            goto LAB_0010626b;
            sVar24 = (*pZip->m_pRead)(pZip->m_pIO_opaque,zip64_end_of_central_dir_locator_u32._8_8_,
                                      zip64_end_of_central_dir_header_u32,0x38);
            if ((sVar24 == 0x38) && (zip64_end_of_central_dir_header_u32[0] == 0x6064b50)) {
              pZip->m_pState->m_zip64 = 1;
            }
          }
          pZip->m_total_files = (uint)buf_u32[2]._2_2_;
          pmVar26 = pZip->m_pState;
          if (pmVar26->m_zip64 == 0) {
            zip64_end_of_central_dir_header_u32[6] = (mz_uint32)(ushort)buf_u32[2];
            zip64_end_of_central_dir_header_u32[5] = (mz_uint32)buf_u32[1]._2_2_;
            uVar27 = (ulong)buf_u32[4];
            mVar25 = buf_u32[3];
            zip64_end_of_central_dir_header_u32[8] = (uint)buf_u32[2]._2_2_;
            uVar23 = (uint)(ushort)buf_u32[1];
LAB_001062ad:
            if ((zip64_end_of_central_dir_header_u32[8] == zip64_end_of_central_dir_header_u32[6])
               && ((uVar23 == 0 && zip64_end_of_central_dir_header_u32[5] == 0 ||
                   (zip64_end_of_central_dir_header_u32[5] == 1 && uVar23 == 1)))) {
              if ((mVar25 < zip64_end_of_central_dir_header_u32[8] * 0x2e) ||
                 (uVar16 = (ulong)mVar25, pZip->m_archive_size < uVar16 + uVar27))
              goto LAB_0010625e;
              pZip->m_central_directory_file_ofs = uVar27;
              if (zip64_end_of_central_dir_header_u32[8] == 0) {
                return 1;
              }
              pmVar17 = pmVar26;
              if ((pmVar26->m_central_dir).m_capacity < uVar16) {
                mVar13 = mz_zip_array_ensure_capacity(pZip,&pmVar26->m_central_dir,uVar16,0);
                if (mVar13 != 0) {
                  pmVar17 = pZip->m_pState;
                  zip64_end_of_central_dir_header_u32[8] = pZip->m_total_files;
                  goto LAB_00106331;
                }
LAB_00106423:
                mVar28 = MZ_ZIP_ALLOC_FAILED;
                goto LAB_0010626b;
              }
LAB_00106331:
              (pmVar26->m_central_dir).m_size = uVar16;
              uVar20 = (ulong)zip64_end_of_central_dir_header_u32[8];
              pmVar26 = pmVar17;
              if ((pmVar17->m_central_dir_offsets).m_capacity < uVar20) {
                mVar13 = mz_zip_array_ensure_capacity(pZip,&pmVar17->m_central_dir_offsets,uVar20,0)
                ;
                if (mVar13 == 0) goto LAB_00106423;
                pmVar26 = pZip->m_pState;
              }
              (pmVar17->m_central_dir_offsets).m_size = uVar20;
              if ((flags >> 0xb & 1) == 0) {
                uVar20 = (ulong)pZip->m_total_files;
                pmVar17 = pmVar26;
                if ((pmVar26->m_sorted_central_dir_offsets).m_capacity < uVar20) {
                  mVar13 = mz_zip_array_ensure_capacity
                                     (pZip,&pmVar26->m_sorted_central_dir_offsets,uVar20,0);
                  mVar28 = MZ_ZIP_ALLOC_FAILED;
                  if (mVar13 == 0) goto LAB_0010626b;
                  pmVar17 = pZip->m_pState;
                }
                (pmVar26->m_sorted_central_dir_offsets).m_size = uVar20;
                pmVar26 = pmVar17;
              }
              sVar24 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar27,(pmVar26->m_central_dir).m_p,
                                        uVar16);
              mVar28 = MZ_ZIP_FILE_READ_FAILED;
              if (sVar24 != uVar16) goto LAB_0010626b;
              pmVar26 = pZip->m_pState;
              piVar7 = (int *)(pmVar26->m_central_dir).m_p;
              uVar27 = 0;
              piVar29 = piVar7;
              goto LAB_00106466;
            }
          }
          else {
            if ((ulong)zip64_end_of_central_dir_header_u32._4_8_ < 0x2c) {
LAB_0010625e:
              mVar28 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              goto LAB_0010626b;
            }
            if (zip64_end_of_central_dir_locator_u32[4] == 1) {
              mVar28 = MZ_ZIP_TOO_MANY_FILES;
              if ((zip64_end_of_central_dir_header_u32[9] == 0) &&
                 (pZip->m_total_files = zip64_end_of_central_dir_header_u32[8],
                 zip64_end_of_central_dir_header_u32[7] == 0)) {
                uVar27 = zip64_end_of_central_dir_header_u32._48_8_;
                mVar25 = zip64_end_of_central_dir_header_u32[10];
                uVar23 = zip64_end_of_central_dir_header_u32[4];
                if (zip64_end_of_central_dir_header_u32[0xb] == 0) goto LAB_001062ad;
                mVar28 = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
              }
              goto LAB_0010626b;
            }
          }
          mVar28 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
          goto LAB_0010626b;
        }
      }
      if (mVar34 == 0) break;
      uVar27 = pZip->m_archive_size;
      uVar16 = uVar27 - mVar34;
      mVar34 = mVar34 - 0xffd;
    } while (uVar16 < 0x10015);
    mVar28 = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
LAB_0010626b:
  pZip->m_last_error = mVar28;
  return 0;
LAB_00106466:
  uVar14 = pZip->m_total_files;
  uVar16 = (ulong)uVar14;
  if (uVar16 <= uVar27) goto LAB_001065fa;
  if ((mVar25 < 0x2e) || (*piVar29 != 0x2014b50)) {
LAB_001065eb:
    mVar28 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    goto LAB_0010626b;
  }
  *(int *)((long)(pmVar26->m_central_dir_offsets).m_p + uVar27 * 4) = (int)piVar29 - (int)piVar7;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar26->m_sorted_central_dir_offsets).m_p + uVar27 * 4) = (int)uVar27;
  }
  uVar14 = piVar29[5];
  uVar6 = piVar29[6];
  uVar4 = *(ushort *)(piVar29 + 7);
  uVar5 = *(ushort *)((long)piVar29 + 0x1e);
  if ((pmVar26->m_zip64_has_extended_info_fields == 0) && (uVar5 != 0)) {
    uVar33 = uVar6;
    if (uVar6 < uVar14) {
      uVar33 = uVar14;
    }
    if (uVar33 <= *(uint *)((long)piVar29 + 0x2a)) {
      uVar33 = *(uint *)((long)piVar29 + 0x2a);
    }
    if (uVar33 == 0xffffffff) {
      psVar18 = (short *)((long)piVar29 + (ulong)uVar4 + 0x2e);
      uVar33 = (uint)uVar5;
      do {
        if (uVar33 < 4) goto LAB_001065eb;
        puVar1 = (ushort *)(psVar18 + 1);
        uVar16 = (ulong)*puVar1 + 4;
        if (uVar33 < uVar16) goto LAB_001065eb;
        if (*psVar18 == 1) {
          pmVar26->m_zip64 = 1;
          pmVar26->m_zip64_has_extended_info_fields = 1;
          break;
        }
        psVar18 = (short *)((long)psVar18 + uVar16);
        uVar33 = (uVar33 - *puVar1) - 4;
      } while (uVar33 != 0);
    }
  }
  if ((uVar6 != 0xffffffff && uVar14 != 0xffffffff) &&
     ((uVar6 != uVar14 && *(int *)((long)piVar29 + 10) == 0 || (uVar14 == 0 && uVar6 != 0))))
  goto LAB_001065eb;
  uVar12 = *(ushort *)((long)piVar29 + 0x22);
  if ((uVar12 == 0xffff) || ((uVar12 != 1 && (uVar23 != uVar12)))) {
    mVar28 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    goto LAB_0010626b;
  }
  if ((uVar14 != 0xffffffff) &&
     (pZip->m_archive_size < (ulong)*(uint *)((long)piVar29 + 0x2a) + (ulong)uVar14 + 0x1e))
  goto LAB_001065eb;
  if ((*(byte *)((long)piVar29 + 9) & 0x20) != 0) {
    mVar28 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    goto LAB_0010626b;
  }
  uVar14 = (uint)*(ushort *)(piVar29 + 8) + (uint)uVar4 + (uint)uVar5 + 0x2e;
  bVar37 = mVar25 < uVar14;
  mVar25 = mVar25 - uVar14;
  if (bVar37) goto LAB_001065eb;
  piVar29 = (int *)((long)piVar29 + (ulong)uVar14);
  uVar27 = uVar27 + 1;
  goto LAB_00106466;
LAB_001065fa:
  if (((flags >> 0xb & 1) == 0) && (1 < uVar14)) {
    puVar8 = (uint *)(pmVar26->m_sorted_central_dir_offsets).m_p;
    uVar27 = (ulong)(uVar14 - 2 >> 1);
    uVar20 = uVar27;
LAB_00106636:
    do {
      uVar19 = uVar27 * 2 + 1;
      if (uVar19 < uVar16) {
        pvVar9 = (pmVar26->m_central_dir).m_p;
        pvVar10 = (pmVar26->m_central_dir_offsets).m_p;
        if (uVar27 * 2 + 2 < uVar16) {
          uVar36 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar19] * 4);
          uVar30 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar27 * 2 + 2] * 4);
          uVar4 = *(ushort *)((long)pvVar9 + uVar36 + 0x1c);
          uVar5 = *(ushort *)((long)pvVar9 + uVar30 + 0x1c);
          uVar12 = uVar5;
          if (uVar4 < uVar5) {
            uVar12 = uVar4;
          }
          bVar21 = 0;
          for (uVar35 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar35 + uVar36 + 0x2e), bVar11 = bVar21
              , pbVar2 < (byte *)((long)pvVar9 + uVar12 + uVar36 + 0x2e); uVar35 = uVar35 + 1) {
            bVar11 = *pbVar2;
            bVar21 = bVar11 + 0x20;
            if (0x19 < (byte)(bVar11 + 0xbf)) {
              bVar21 = bVar11;
            }
            bVar3 = *(byte *)((long)pvVar9 + uVar35 + uVar30 + 0x2e);
            bVar11 = bVar3 + 0x20;
            if (0x19 < (byte)(bVar3 + 0xbf)) {
              bVar11 = bVar3;
            }
            if (bVar21 != bVar11) break;
          }
          bVar37 = bVar21 < bVar11;
          if (uVar12 == uVar35) {
            bVar37 = uVar4 < uVar5;
          }
          uVar30 = (ulong)bVar37;
        }
        else {
          uVar30 = 0;
        }
        uVar30 = uVar30 + uVar19;
        uVar23 = puVar8[uVar27];
        uVar19 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar23 * 4);
        uVar36 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar30] * 4);
        uVar4 = *(ushort *)((long)pvVar9 + uVar19 + 0x1c);
        uVar5 = *(ushort *)((long)pvVar9 + uVar36 + 0x1c);
        uVar12 = uVar5;
        if (uVar4 < uVar5) {
          uVar12 = uVar4;
        }
        bVar21 = 0;
        for (uVar35 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar35 + uVar19 + 0x2e), bVar11 = bVar21,
            pbVar2 < (byte *)((long)pvVar9 + uVar12 + uVar19 + 0x2e); uVar35 = uVar35 + 1) {
          bVar11 = *pbVar2;
          bVar21 = bVar11 + 0x20;
          if (0x19 < (byte)(bVar11 + 0xbf)) {
            bVar21 = bVar11;
          }
          bVar3 = *(byte *)((long)pvVar9 + uVar35 + uVar36 + 0x2e);
          bVar11 = bVar3 + 0x20;
          if (0x19 < (byte)(bVar3 + 0xbf)) {
            bVar11 = bVar3;
          }
          if (bVar21 != bVar11) break;
        }
        bVar37 = bVar11 <= bVar21;
        if (uVar12 == uVar35) {
          bVar37 = uVar5 <= uVar4;
        }
        if (!bVar37) {
          puVar8[uVar27] = puVar8[uVar30];
          puVar8[uVar30] = uVar23;
          uVar27 = uVar30;
          goto LAB_00106636;
        }
      }
      bVar37 = uVar20 != 0;
      uVar27 = uVar20 - 1;
      uVar20 = uVar27;
    } while (bVar37);
LAB_001069c8:
    uVar27 = uVar16 - 1;
    if (uVar27 != 0) {
      uVar23 = puVar8[uVar16 - 1];
      puVar8[uVar16 - 1] = *puVar8;
      *puVar8 = uVar23;
      lVar22 = 0;
      while( true ) {
        uVar20 = lVar22 * 2 + 1;
        uVar16 = uVar27;
        if (uVar27 <= uVar20) break;
        pvVar9 = (pmVar26->m_central_dir).m_p;
        pvVar10 = (pmVar26->m_central_dir_offsets).m_p;
        if (lVar22 * 2 + 2U < uVar27) {
          uVar30 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar20] * 4);
          uVar19 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[lVar22 * 2 + 2] * 4);
          uVar4 = *(ushort *)((long)pvVar9 + uVar30 + 0x1c);
          uVar5 = *(ushort *)((long)pvVar9 + uVar19 + 0x1c);
          uVar12 = uVar5;
          if (uVar4 < uVar5) {
            uVar12 = uVar4;
          }
          bVar21 = 0;
          for (uVar36 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar36 + uVar30 + 0x2e), bVar11 = bVar21
              , pbVar2 < (byte *)((long)pvVar9 + uVar12 + uVar30 + 0x2e); uVar36 = uVar36 + 1) {
            bVar11 = *pbVar2;
            bVar21 = bVar11 + 0x20;
            if (0x19 < (byte)(bVar11 + 0xbf)) {
              bVar21 = bVar11;
            }
            bVar3 = *(byte *)((long)pvVar9 + uVar36 + uVar19 + 0x2e);
            bVar11 = bVar3 + 0x20;
            if (0x19 < (byte)(bVar3 + 0xbf)) {
              bVar11 = bVar3;
            }
            if (bVar21 != bVar11) break;
          }
          bVar37 = bVar21 < bVar11;
          if (uVar12 == uVar36) {
            bVar37 = uVar4 < uVar5;
          }
          uVar19 = (ulong)bVar37;
        }
        else {
          uVar19 = 0;
        }
        lVar31 = uVar19 + uVar20;
        uVar20 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar23 * 4);
        uVar19 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[lVar31] * 4);
        uVar4 = *(ushort *)((long)pvVar9 + uVar20 + 0x1c);
        uVar5 = *(ushort *)((long)pvVar9 + uVar19 + 0x1c);
        uVar12 = uVar5;
        if (uVar4 < uVar5) {
          uVar12 = uVar4;
        }
        bVar21 = 0;
        for (uVar30 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar30 + uVar20 + 0x2e), bVar11 = bVar21,
            pbVar2 < (byte *)((long)pvVar9 + uVar12 + uVar20 + 0x2e); uVar30 = uVar30 + 1) {
          bVar11 = *pbVar2;
          bVar21 = bVar11 + 0x20;
          if (0x19 < (byte)(bVar11 + 0xbf)) {
            bVar21 = bVar11;
          }
          bVar3 = *(byte *)((long)pvVar9 + uVar30 + uVar19 + 0x2e);
          bVar11 = bVar3 + 0x20;
          if (0x19 < (byte)(bVar3 + 0xbf)) {
            bVar11 = bVar3;
          }
          if (bVar21 != bVar11) break;
        }
        bVar37 = bVar11 <= bVar21;
        if (uVar12 == uVar30) {
          bVar37 = uVar5 <= uVar4;
        }
        if (bVar37) break;
        puVar8[lVar22] = puVar8[lVar31];
        puVar8[lVar31] = uVar23;
        lVar22 = lVar31;
      }
      goto LAB_001069c8;
    }
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
                    const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

                        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}